

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# document.h
# Opt level: O3

MemberIterator __thiscall
rapidjson::
GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>::
DoFindMember<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
          (GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
           *this,GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                 *name)

{
  uint16_t uVar1;
  ulong uVar2;
  bool bVar3;
  GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
  *in_RDX;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_> *rhs
  ;
  
  if ((name->data_).f.flags != 3) {
    __assert_fail("IsObject()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Forestryks[P]libsbox/external/include/rapidjson/document.h"
                  ,0x4fa,
                  "MemberIterator rapidjson::GenericValue<rapidjson::UTF8<>>::MemberBegin() [Encoding = rapidjson::UTF8<>, Allocator = rapidjson::MemoryPoolAllocator<>]"
                 );
  }
  uVar2 = *(ulong *)((long)&name->data_ + 8);
  rhs = (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
         *)(uVar2 & 0xffffffffffff);
  uVar1 = (uint16_t)(uVar2 >> 0x30);
  while( true ) {
    if (uVar1 != 3) {
      *(GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        **)this = rhs;
      __assert_fail("IsObject()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Forestryks[P]libsbox/external/include/rapidjson/document.h"
                    ,0x4fd,
                    "MemberIterator rapidjson::GenericValue<rapidjson::UTF8<>>::MemberEnd() [Encoding = rapidjson::UTF8<>, Allocator = rapidjson::MemoryPoolAllocator<>]"
                   );
    }
    if ((rhs == (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                 *)((ulong)(name->data_).s.length * 0x20 +
                   ((ulong)(name->data_).s.str & 0xffffffffffff))) ||
       (bVar3 = StringEqual<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>(in_RDX,rhs),
       bVar3)) break;
    rhs = rhs + 2;
    uVar1 = (name->data_).f.flags;
  }
  *(GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_> **
   )this = rhs;
  return (MemberIterator)(Pointer)this;
}

Assistant:

bool IsObject() const { return data_.f.flags == kObjectFlag; }